

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Brainfck.cpp
# Opt level: O3

void __thiscall
implementations::brainfck::BFImplementation::~BFImplementation(BFImplementation *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->
  super_Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>
  )._vptr_Implementation = (_func_int **)&PTR_getCurrentFrame_00130978;
  (this->frame).super_BFStacklessFrame._vptr_Frame = (_func_int **)&PTR__Frame_00130a68;
  p_Var1 = (this->frame).super_BFStacklessFrame.env.
           super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  (this->
  super_Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>
  )._vptr_Implementation = (_func_int **)&PTR___cxa_pure_virtual_001309d8;
  p_Var1 = (this->
           super_Implementation<implementations::brainfck::BFEnvironment,_implementations::brainfck::BFFrame>
           ).env.
           super___shared_ptr<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    return;
  }
  return;
}

Assistant:

BFImplementation(env_p _env) : Implementation(_env), frame(BFFrame(_env)) {
	}